

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<FileHeader>::reallocate
          (QMovableArrayOps<FileHeader> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<FileHeader>_*,_FileHeader_*> pVar1;
  
  pVar1 = QTypedArrayData<FileHeader>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<FileHeader>).super_QArrayDataPointer<FileHeader>.
                     d,(this->super_QGenericArrayOps<FileHeader>).
                       super_QArrayDataPointer<FileHeader>.ptr,alloc,option);
  if (pVar1.second != (FileHeader *)0x0) {
    (this->super_QGenericArrayOps<FileHeader>).super_QArrayDataPointer<FileHeader>.d = pVar1.first;
    (this->super_QGenericArrayOps<FileHeader>).super_QArrayDataPointer<FileHeader>.ptr =
         pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }